

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

_Bool ray_intersect_aabb(vec3 ro,vec3 rd,vec3 aabb_min,vec3 aabb_max,float *t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar11;
  undefined1 auVar10 [16];
  float in_XMM5_Db;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float in_XMM7_Db;
  
  fVar8 = rd.z;
  auVar17._0_8_ = rd._0_8_;
  auVar17._8_8_ = rd._0_8_;
  fVar7 = ro.z;
  auVar10._0_4_ = aabb_min.x - ro.x;
  auVar10._4_4_ = aabb_min.y - ro.y;
  auVar10._8_4_ = aabb_min.x - in_XMM0_Dc;
  auVar10._12_4_ = aabb_min.y - in_XMM0_Dd;
  auVar10 = divps(auVar10,auVar17);
  auVar16._0_4_ = aabb_max.x - ro.x;
  auVar16._4_4_ = aabb_max.y - ro.y;
  auVar16._8_4_ = aabb_max.x - in_XMM0_Dc;
  auVar16._12_4_ = aabb_max.y - in_XMM0_Dd;
  auVar17 = divps(auVar16,auVar17);
  fVar14 = auVar17._0_4_;
  fVar18 = auVar17._4_4_;
  fVar9 = auVar10._0_4_;
  fVar11 = auVar10._4_4_;
  uVar4 = -(uint)(fVar14 < fVar9);
  uVar5 = -(uint)(fVar18 < fVar11);
  fVar15 = (float)((uint)fVar14 & uVar4 | ~uVar4 & (uint)fVar9);
  fVar6 = (float)((uint)fVar11 & uVar5 | ~uVar5 & (uint)fVar18);
  _Var3 = false;
  if (fVar15 <= fVar6) {
    fVar14 = (float)(~uVar4 & (uint)fVar14 | (uint)fVar9 & uVar4);
    fVar9 = (float)(~uVar5 & (uint)fVar11 | (uint)fVar18 & uVar5);
    if (fVar9 <= fVar14) {
      auVar2._4_4_ = -(uint)(fVar15 < fVar9);
      auVar2._0_4_ = -(uint)(fVar15 < fVar9);
      auVar2._8_4_ = -(uint)(fVar6 < fVar14);
      auVar2._12_4_ = -(uint)(fVar6 < fVar14);
      uVar4 = movmskpd(0,auVar2);
      if ((uVar4 & 1) == 0) {
        fVar9 = fVar15;
      }
      if ((uVar4 & 2) == 0) {
        fVar6 = fVar14;
      }
      auVar12._0_4_ = aabb_min.z - fVar7;
      auVar12._4_4_ = aabb_max.z - fVar7;
      auVar12._8_4_ = in_XMM5_Db - fVar7;
      auVar12._12_4_ = in_XMM7_Db - fVar7;
      auVar1._4_4_ = fVar8;
      auVar1._0_4_ = fVar8;
      auVar1._8_4_ = fVar8;
      auVar1._12_4_ = fVar8;
      auVar13 = divps(auVar12,auVar1);
      fVar8 = auVar13._0_4_;
      fVar7 = auVar13._4_4_;
      if (fVar8 <= fVar7) {
        auVar13._0_4_ = fVar7;
      }
      _Var3 = false;
      if (fVar9 <= auVar13._0_4_) {
        if (fVar8 <= fVar7) {
          fVar7 = fVar8;
        }
        _Var3 = false;
        if (fVar7 <= fVar6) {
          if (fVar7 <= fVar9) {
            fVar7 = fVar9;
          }
          *t = fVar7;
          _Var3 = true;
        }
      }
    }
  }
  return _Var3;
}

Assistant:

bool ray_intersect_aabb(vec3 ro, vec3 rd, vec3 aabb_min, vec3 aabb_max, float *t) {
    vec3 min = aabb_min;
    vec3 max = aabb_max;

    float tmin = (min.x - ro.x) / rd.x;
    float tmax = (max.x - ro.x) / rd.x;

    if (tmin > tmax) {
        float temp = tmin;
        tmin = tmax;
        tmax = temp;
    }

    float tymin = (min.y - ro.y) / rd.y;
    float tymax = (max.y - ro.y) / rd.y;

    if (tymin > tymax) {
        float temp = tymin;
        tymin = tymax;
        tymax = temp;
    }

    if ((tmin > tymax) || (tymin > tmax))
        return false;

    if (tymin > tmin)
        tmin = tymin;

    if (tymax < tmax)
        tmax = tymax;

    float tzmin = (min.z - ro.z) / rd.z;
    float tzmax = (max.z - ro.z) / rd.z;

    if (tzmin > tzmax) {
        float temp = tzmin;
        tzmin = tzmax;
        tzmax = temp;
    }

    if ((tmin > tzmax) || (tzmin > tmax))
        return false;

    if (tzmin > tmin)
        tmin = tzmin;

    if (tzmax < tmax)
        tmax = tzmax;

    *t = tmin;

    return true;
}